

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  long in_RSI;
  EVP_PKEY_CTX *ctx;
  int in_EDI;
  QuantNet *in_stack_00000070;
  size_t input_blob_count;
  char *value;
  char *key;
  char *eqs;
  char *kv;
  int i_1;
  string method;
  QuantNet net;
  Option opt;
  char *outtable;
  char *lists;
  char *inbin;
  char *inparam;
  int i;
  undefined4 in_stack_000003f4;
  char *in_stack_fffffffffffffc08;
  QuantNet *in_stack_fffffffffffffc10;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc18;
  FILE *pFVar6;
  undefined6 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc26;
  undefined1 in_stack_fffffffffffffc27;
  Net *in_stack_fffffffffffffc28;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_stack_fffffffffffffc40;
  QuantNet *this;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  char *pcVar7;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  undefined1 uVar8;
  QuantNet *in_stack_fffffffffffffca0;
  allocator local_2f1;
  string local_2f0 [128];
  char *local_270;
  int *local_268;
  char *local_260;
  int *local_258;
  int local_250;
  allocator local_249;
  undefined1 local_248 [80];
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_1f8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvStack_1f0;
  pointer local_1e8;
  pointer pvStack_1e0;
  pointer local_1d8;
  pointer pvStack_1d0;
  pointer local_1c8;
  pointer pvStack_1c0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1a0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_188;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_170;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_158;
  vector<int,_std::allocator<int>_> local_140;
  uint local_128;
  vector<int,_std::allocator<int>_> avStack_120 [7];
  undefined4 local_78;
  undefined4 uStack_74;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvStack_70;
  pointer local_68;
  pointer pvStack_60;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined4 uStack_54;
  pointer pvStack_50;
  pointer local_48;
  pointer pvStack_40;
  undefined8 local_38;
  undefined8 local_30;
  EVP_PKEY_CTX *local_28;
  undefined8 local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 5) {
    show_usage();
    return -1;
  }
  for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
    if (**(char **)(in_RSI + (long)local_14 * 8) == '-') {
      show_usage();
      return -1;
    }
  }
  local_20 = *(undefined8 *)(in_RSI + 8);
  local_28 = *(EVP_PKEY_CTX **)(in_RSI + 0x10);
  local_30 = *(undefined8 *)(in_RSI + 0x18);
  local_38 = *(undefined8 *)(in_RSI + 0x20);
  local_10 = in_RSI;
  local_8 = in_EDI;
  ncnn::Option::Option((Option *)in_stack_fffffffffffffc10);
  uStack_74 = 1;
  uStack_57 = 0;
  uStack_56 = 0;
  uStack_55 = 0;
  QuantNet::QuantNet(in_stack_fffffffffffffca0);
  local_1f8 = (vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)CONCAT44(uStack_74,local_78);
  local_1d8 = (pointer)CONCAT44(uStack_54,
                                CONCAT13(uStack_55,CONCAT12(uStack_56,CONCAT11(uStack_57,local_58)))
                               );
  local_1c8 = local_48;
  pvStack_1c0 = pvStack_40;
  pvStack_1d0 = pvStack_50;
  local_1e8 = local_68;
  pvStack_1e0 = pvStack_60;
  pvStack_1f0 = pvStack_70;
  ncnn::Net::load_param
            (in_stack_fffffffffffffc28,
             (char *)CONCAT17(in_stack_fffffffffffffc27,
                              CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
  ctx = local_28;
  ncnn::Net::load_model
            (in_stack_fffffffffffffc28,
             (char *)CONCAT17(in_stack_fffffffffffffc27,
                              CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
  QuantNet::init((QuantNet *)(local_248 + 0x48),ctx);
  parse_comma_path_list_abi_cxx11_((char *)method._M_string_length);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffc27,
                          CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
              (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_stack_fffffffffffffc18);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffc27,
                        CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_248,"kl",&local_249);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  for (local_250 = 5; local_250 < local_8; local_250 = local_250 + 1) {
    local_258 = *(int **)(local_10 + (long)local_250 * 8);
    local_260 = strchr((char *)local_258,0x3d);
    if (local_260 == (char *)0x0) {
      fprintf(_stderr,"unrecognized arg %s\n",local_258);
    }
    else {
      *local_260 = '\0';
      local_268 = local_258;
      local_270 = local_260 + 1;
      if (*local_258 == 0x6e61656d) {
        parse_comma_float_array_list
                  ((char *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator=((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc27,
                                CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
                    (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)in_stack_fffffffffffffc18);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffc27,
                              CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
      }
      if (*local_268 == 0x6d726f6e) {
        parse_comma_float_array_list
                  ((char *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::operator=((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc27,
                                CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
                    (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)in_stack_fffffffffffffc18);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffc27,
                              CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
      }
      iVar2 = memcmp(local_268,"shape",5);
      if (iVar2 == 0) {
        parse_comma_int_array_list
                  ((char *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc27,
                                CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
                    (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)in_stack_fffffffffffffc18);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffc27,
                              CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
      }
      iVar2 = memcmp(local_268,"pixel",5);
      if (iVar2 == 0) {
        parse_comma_pixel_type_list
                  ((char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffc27,
                            CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
                   in_stack_fffffffffffffc18);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffc27,
                            CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
      }
      iVar2 = memcmp(local_268,"thread",6);
      if (iVar2 == 0) {
        local_128 = atoi(local_270);
      }
      iVar2 = memcmp(local_268,"method",6);
      pcVar7 = local_270;
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f0,pcVar7,&local_2f1);
        std::__cxx11::string::operator=((string *)local_248,local_2f0);
        std::__cxx11::string::~string(local_2f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      }
    }
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size(avStack_120);
  sVar4 = std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::size(&local_1a0);
  pFVar6 = _stderr;
  if (sVar4 == sVar3) {
    sVar4 = std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::size(&local_188);
    pFVar6 = _stderr;
    if (sVar4 == sVar3) {
      sVar4 = std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::size(&local_170);
      if (sVar4 == sVar3) {
        sVar4 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::size(&local_158);
        pFVar6 = _stderr;
        if (sVar4 == sVar3) {
          sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_140);
          pFVar6 = _stderr;
          if (sVar4 == sVar3) {
            if ((int)local_128 < 0) {
              fprintf(_stderr,"malformed thread %d\n",(ulong)local_128);
              local_4 = -1;
            }
            else {
              fprintf(_stderr,"mean = ");
              print_float_array_list(in_stack_fffffffffffffc40);
              pcVar7 = &stderr;
              uVar8 = 0;
              fprintf(_stderr,"\n");
              fprintf(*(FILE **)pcVar7,"norm = ");
              print_float_array_list(in_stack_fffffffffffffc40);
              fprintf(_stderr,"\n");
              fprintf(_stderr,"shape = ");
              print_int_array_list
                        ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)in_stack_fffffffffffffc40);
              fprintf(_stderr,"\n");
              fprintf(_stderr,"pixel = ");
              print_pixel_type_list
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_fffffffffffffc27,
                                  CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
              fprintf(_stderr,"\n");
              fprintf(_stderr,"thread = %d\n",(ulong)local_128);
              this = (QuantNet *)local_248;
              pFVar6 = _stderr;
              uVar5 = std::__cxx11::string::c_str();
              fprintf(pFVar6,"method = %s\n",uVar5);
              fprintf(_stderr,"---------------------------------------\n");
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
              if (bVar1) {
                QuantNet::quantize_KL((QuantNet *)CONCAT44(in_stack_000003f4,argc));
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
                if (bVar1) {
                  QuantNet::quantize_ACIQ(in_stack_00000070);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
                  if (!bVar1) {
                    fprintf(_stderr,"not implemented yet !\n");
                    pFVar6 = _stderr;
                    uVar5 = std::__cxx11::string::c_str();
                    fprintf(pFVar6,"unknown method %s, expect kl / aciq / eq\n",uVar5);
                    local_4 = -1;
                    goto LAB_00153f77;
                  }
                  QuantNet::quantize_EQ
                            ((QuantNet *)
                             net.quant_blob_stats.
                             super__Vector_base<QuantBlobStat,_std::allocator<QuantBlobStat>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
                }
              }
              in_stack_fffffffffffffc10 = (QuantNet *)(local_248 + 0x48);
              QuantNet::print_quant_info(this);
              QuantNet::save_table((QuantNet *)CONCAT17(uVar8,in_stack_fffffffffffffc78),pcVar7);
              local_4 = 0;
            }
          }
          else {
            sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_140);
            fprintf(pFVar6,"expect %d pixels, but got %d\n",sVar3 & 0xffffffff,sVar4 & 0xffffffff);
            local_4 = -1;
          }
        }
        else {
          sVar4 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::size(&local_158);
          fprintf(pFVar6,"expect %d shapes, but got %d\n",sVar3 & 0xffffffff,sVar4 & 0xffffffff);
          local_4 = -1;
        }
      }
      else {
        pFVar6 = _stderr;
        sVar4 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size(&local_170);
        fprintf(pFVar6,"expect %d norms, but got %d\n",sVar3 & 0xffffffff,sVar4 & 0xffffffff);
        local_4 = -1;
      }
    }
    else {
      sVar4 = std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::size(&local_188);
      fprintf(pFVar6,"expect %d means, but got %d\n",sVar3 & 0xffffffff,sVar4 & 0xffffffff);
      local_4 = -1;
    }
  }
  else {
    sVar4 = std::
            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::size(&local_1a0);
    fprintf(pFVar6,"expect %d lists, but got %d\n",sVar3 & 0xffffffff,sVar4 & 0xffffffff);
    local_4 = -1;
  }
LAB_00153f77:
  std::__cxx11::string::~string((string *)local_248);
  QuantNet::~QuantNet(in_stack_fffffffffffffc10);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 5)
    {
        show_usage();
        return -1;
    }

    for (int i = 1; i < argc; i++)
    {
        if (argv[i][0] == '-')
        {
            show_usage();
            return -1;
        }
    }

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    char* lists = argv[3];
    const char* outtable = argv[4];

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_fp16_packed = false;
    opt.use_fp16_storage = false;
    opt.use_fp16_arithmetic = false;

    QuantNet net;
    net.opt = opt;
    net.load_param(inparam);
    net.load_model(inbin);

    net.init();

    // load lists
    net.listspaths = parse_comma_path_list(lists);

    std::string method = "kl";

    for (int i = 5; i < argc; i++)
    {
        // key=value
        char* kv = argv[i];

        char* eqs = strchr(kv, '=');
        if (eqs == NULL)
        {
            fprintf(stderr, "unrecognized arg %s\n", kv);
            continue;
        }

        // split k v
        eqs[0] = '\0';
        const char* key = kv;
        char* value = eqs + 1;

        // load mean norm shape
        if (memcmp(key, "mean", 4) == 0)
            net.means = parse_comma_float_array_list(value);
        if (memcmp(key, "norm", 4) == 0)
            net.norms = parse_comma_float_array_list(value);
        if (memcmp(key, "shape", 5) == 0)
            net.shapes = parse_comma_int_array_list(value);
        if (memcmp(key, "pixel", 5) == 0)
            net.type_to_pixels = parse_comma_pixel_type_list(value);
        if (memcmp(key, "thread", 6) == 0)
            net.quantize_num_threads = atoi(value);
        if (memcmp(key, "method", 6) == 0)
            method = std::string(value);
    }

    // sanity check
    const size_t input_blob_count = net.input_blobs.size();
    if (net.listspaths.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d lists, but got %d\n", (int)input_blob_count, (int)net.listspaths.size());
        return -1;
    }
    if (net.means.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d means, but got %d\n", (int)input_blob_count, (int)net.means.size());
        return -1;
    }
    if (net.norms.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d norms, but got %d\n", (int)input_blob_count, (int)net.norms.size());
        return -1;
    }
    if (net.shapes.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d shapes, but got %d\n", (int)input_blob_count, (int)net.shapes.size());
        return -1;
    }
    if (net.type_to_pixels.size() != input_blob_count)
    {
        fprintf(stderr, "expect %d pixels, but got %d\n", (int)input_blob_count, (int)net.type_to_pixels.size());
        return -1;
    }
    if (net.quantize_num_threads < 0)
    {
        fprintf(stderr, "malformed thread %d\n", net.quantize_num_threads);
        return -1;
    }

    // print quantnet config
    {
        fprintf(stderr, "mean = ");
        print_float_array_list(net.means);
        fprintf(stderr, "\n");
        fprintf(stderr, "norm = ");
        print_float_array_list(net.norms);
        fprintf(stderr, "\n");
        fprintf(stderr, "shape = ");
        print_int_array_list(net.shapes);
        fprintf(stderr, "\n");
        fprintf(stderr, "pixel = ");
        print_pixel_type_list(net.type_to_pixels);
        fprintf(stderr, "\n");
        fprintf(stderr, "thread = %d\n", net.quantize_num_threads);
        fprintf(stderr, "method = %s\n", method.c_str());
        fprintf(stderr, "---------------------------------------\n");
    }

    if (method == "kl")
    {
        net.quantize_KL();
    }
    else if (method == "aciq")
    {
        net.quantize_ACIQ();
    }
    else if (method == "eq")
    {
        net.quantize_EQ();
    }
    else
    {
        fprintf(stderr, "not implemented yet !\n");
        fprintf(stderr, "unknown method %s, expect kl / aciq / eq\n", method.c_str());
        return -1;
    }

    net.print_quant_info();

    net.save_table(outtable);

    return 0;
}